

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManSwitchesAndGlitches(Gli_Man_t *p,int nPatterns,float PiTransProb,int fVerbose)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Gia_ManRandom(1);
  Gli_ManFinalize(p);
  if (p->nRegs == 0) {
    iVar1 = nPatterns;
    if (0 < nPatterns) {
      do {
        Gli_ManSetPiRandom(p,PiTransProb);
        Gli_ManSwitching(p);
        Gli_ManGlitching(p);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  else {
    iVar1 = ((nPatterns >> 5) + 1) - (uint)((nPatterns & 0x1fU) == 0);
    Gli_ManSimulateSeqPref(p,0x10);
    iVar4 = 0;
    do {
      Gli_ManSetDataSaved(p,iVar4);
      iVar5 = iVar1;
      if (0 < iVar1) {
        do {
          Gli_ManSetPiRandomSeq(p,PiTransProb);
          Gli_ManSwitching(p);
          Gli_ManGlitching(p);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x20);
  }
  if (fVerbose != 0) {
    iVar1 = 0xa29f2c;
    printf("Simulated %d patterns.  Input transition probability %.2f.  ",(double)PiTransProb,
           (ulong)(uint)nPatterns);
    Abc_Print(iVar1,"%s =","Memory");
    Abc_Print(iVar1,"%10.3f MB  ",(double)(p->nObjData << 2) * 9.5367431640625e-07);
    Abc_Print(iVar1,"%s =","Time");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  }
  return;
}

Assistant:

void Gli_ManSwitchesAndGlitches( Gli_Man_t * p, int nPatterns, float PiTransProb, int fVerbose )
{
    int i, k;
    abctime clk = Abc_Clock();
    Gia_ManRandom( 1 );
    Gli_ManFinalize( p );
    if ( p->nRegs == 0 )
    {
        for ( i = 0; i < nPatterns; i++ )
        {
            Gli_ManSetPiRandom( p, PiTransProb );
            Gli_ManSwitching( p );
            Gli_ManGlitching( p );
//            Gli_ManVerify( p );
        }
    }
    else 
    {
        int nIters = Abc_BitWordNum(nPatterns);
        Gli_ManSimulateSeqPref( p, 16 );
        for ( i = 0; i < 32; i++ )
        {
            Gli_ManSetDataSaved( p, i );
            for ( k = 0; k < nIters; k++ )
            {
                Gli_ManSetPiRandomSeq( p, PiTransProb );
                Gli_ManSwitching( p );
                Gli_ManGlitching( p );
//                Gli_ManVerify( p );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Simulated %d patterns.  Input transition probability %.2f.  ", nPatterns, PiTransProb );
        ABC_PRMn( "Memory", 4*p->nObjData );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
}